

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v9::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 n [16];
  int iVar1;
  char *pcVar2;
  buffer<char> *in_RDX;
  undefined8 in_RSI;
  convert_float_result<long_double> *in_RDI;
  bool bVar3;
  unkbyte10 in_ST0;
  double dVar4;
  longdouble in_stack_00000008;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  basic_fp<unsigned___int128> f_1;
  basic_fp<unsigned___int128> f;
  double inv_log2_10;
  uint dragon_flags;
  bool use_dragon;
  int exp;
  bool fixed;
  convert_float_result<long_double> converted_value;
  int *in_stack_000002c0;
  buffer<char> *in_stack_000002c8;
  int in_stack_000002d0;
  uint in_stack_000002d4;
  basic_fp<unsigned___int128> in_stack_000002e0;
  undefined4 uVar5;
  char value_00;
  int in_stack_fffffffffffffedc;
  undefined2 in_stack_fffffffffffffee0;
  undefined2 uVar6;
  undefined6 in_stack_fffffffffffffee2;
  undefined2 in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffeea;
  undefined6 uVar7;
  buffer<char> *in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefa;
  undefined1 in_stack_fffffffffffffefb;
  basic_fp<unsigned___int128> *in_stack_ffffffffffffff00;
  size_t local_f0;
  undefined8 local_a8;
  buffer<char> *in_stack_ffffffffffffff60;
  undefined2 local_88;
  basic_fp<unsigned___int128> *local_80;
  float local_78;
  int local_50;
  uint uStack_8;
  int local_4;
  
  if (in_stack_00000008 < (longdouble)0) {
    assert_fail((char *)CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
                in_stack_fffffffffffffedc,(char *)0x1d9499);
  }
  uVar5 = SUB104(in_stack_00000008,0);
  iVar1 = (int)((unkuint10)in_stack_00000008 >> 0x20);
  uVar6 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
  convert_float<long_double>(in_RDI,in_stack_00000008);
  uStack_8._0_1_ = (char)((ulong)in_RSI >> 0x20);
  bVar3 = (char)uStack_8 != '\x02';
  if ((longdouble)0 < in_stack_00000008) {
    basic_fp<unsigned___int128>::basic_fp<long_double>
              ((basic_fp<unsigned___int128> *)in_stack_fffffffffffffef0,
               (longdouble)
               CONCAT28(in_stack_fffffffffffffee8,
                        CONCAT62(in_stack_fffffffffffffee2,(short)((unkuint10)in_ST0 >> 0x40))));
    n._8_2_ = in_stack_fffffffffffffef8;
    n._0_8_ = in_stack_fffffffffffffef0;
    n[10] = in_stack_fffffffffffffefa;
    n[0xb] = in_stack_fffffffffffffefb;
    n._12_4_ = local_78;
    iVar1 = count_digits<1,unsigned__int128>((unsigned___int128)n);
    dVar4 = ceil((double)((int)local_78 + iVar1 + -1) * 0.3010299956639812 + -1e-10);
    local_50 = (int)dVar4;
    uStack_8 = (uint)((ulong)in_RSI >> 0x20);
    basic_fp<unsigned___int128>::basic_fp((basic_fp<unsigned___int128> *)&stack0xffffffffffffff48);
    if ((uStack_8 >> 0x12 & 1) == 0) {
      basic_fp<unsigned___int128>::assign<long_double,_0>
                (local_80,(longdouble)CONCAT28(local_88,in_stack_ffffffffffffff60));
    }
    else {
      basic_fp<unsigned___int128>::assign<float,_0>(in_stack_ffffffffffffff00,local_78);
    }
    uVar6 = (undefined2)local_a8;
    uVar7 = SUB86(local_a8,2);
    format_dragon(in_stack_000002e0,in_stack_000002d4,in_stack_000002d0,in_stack_000002c8,
                  in_stack_000002c0);
    if ((bVar3) && ((uStack_8 >> 0x13 & 1) == 0)) {
      local_f0 = buffer<char>::size(in_RDX);
      while( true ) {
        bVar3 = false;
        if (local_f0 != 0) {
          pcVar2 = buffer<char>::operator[]<unsigned_long>(in_RDX,local_f0 - 1);
          bVar3 = *pcVar2 == '0';
        }
        if (!bVar3) break;
        local_f0 = local_f0 - 1;
        local_50 = local_50 + 1;
      }
      buffer<char>::try_resize(in_stack_ffffffffffffff60,CONCAT62(uVar7,uVar6));
    }
    local_4 = local_50;
  }
  else if (((int)in_RDI < 1) || (bVar3)) {
    buffer<char>::push_back
              ((buffer<char> *)CONCAT62(in_stack_fffffffffffffee2,uVar6),
               (char *)CONCAT44(iVar1,uVar5));
    local_4 = 0;
  }
  else {
    to_unsigned<int>(0);
    value_00 = (char)((uint)uVar5 >> 0x18);
    buffer<char>::try_resize
              (in_stack_fffffffffffffef0,
               CONCAT62(in_stack_fffffffffffffeea,in_stack_fffffffffffffee8));
    buffer<char>::data(in_RDX);
    fill_n<char,int>((char *)CONCAT62(in_stack_fffffffffffffee2,uVar6),iVar1,value_00);
    local_4 = -(int)in_RDI;
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}